

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O1

void anon_unknown.dwarf_56e35d::GlContextImpl::loadExtensions(void)

{
  byte bVar1;
  int iVar2;
  GlFunctionPointer p_Var3;
  GlFunctionPointer p_Var4;
  GlFunctionPointer p_Var5;
  GlFunctionPointer p_Var6;
  char *pcVar7;
  byte *pbVar8;
  uint uVar9;
  byte *pbVar10;
  int numExtensions;
  int majorVersion;
  allocator local_5d;
  uint local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_34;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&(anonymous_namespace)::GlContextImpl::extensions_abi_cxx11_);
  p_Var3 = sf::priv::GlContext::getFunction("glGetError");
  p_Var4 = sf::priv::GlContext::getFunction("glGetIntegerv");
  p_Var5 = sf::priv::GlContext::getFunction("glGetString");
  if (p_Var5 != (GlFunctionPointer)0x0 &&
      (p_Var4 != (GlFunctionPointer)0x0 && p_Var3 != (GlFunctionPointer)0x0)) {
    local_34 = 0;
    (*p_Var4)(0x821b);
    p_Var6 = sf::priv::GlContext::getFunction("glGetStringi");
    iVar2 = (*p_Var3)();
    if (p_Var6 == (GlFunctionPointer)0x0 || iVar2 == 0x500) {
      pbVar8 = (byte *)(*p_Var5)(0x1f03);
      pbVar10 = pbVar8;
      do {
        for (; (*pbVar10 & 0xdf) != 0; pbVar10 = pbVar10 + 1) {
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pbVar8,pbVar10);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(anonymous_namespace)::GlContextImpl::extensions_abi_cxx11_,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        pbVar8 = pbVar10 + 1;
        bVar1 = *pbVar10;
        pbVar10 = pbVar8;
      } while (bVar1 != 0);
    }
    else {
      local_5c = 0;
      (*p_Var4)(0x821d,&local_5c);
      if (local_5c != 0) {
        uVar9 = 0;
        do {
          pcVar7 = (char *)(*p_Var6)(0x1f03,(ulong)uVar9);
          std::__cxx11::string::string((string *)&local_58,pcVar7,&local_5d);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &(anonymous_namespace)::GlContextImpl::extensions_abi_cxx11_,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < local_5c);
      }
    }
  }
  return;
}

Assistant:

void loadExtensions()
        {
            extensions.clear();

            glGetErrorFuncType glGetErrorFunc = reinterpret_cast<glGetErrorFuncType>(sf::priv::GlContext::getFunction("glGetError"));
            glGetIntegervFuncType glGetIntegervFunc = reinterpret_cast<glGetIntegervFuncType>(sf::priv::GlContext::getFunction("glGetIntegerv"));
            glGetStringFuncType glGetStringFunc = reinterpret_cast<glGetStringFuncType>(sf::priv::GlContext::getFunction("glGetString"));

            if (!glGetErrorFunc || !glGetIntegervFunc || !glGetStringFunc)
                return;

            // Check whether a >= 3.0 context is available
            int majorVersion = 0;
            glGetIntegervFunc(GL_MAJOR_VERSION, &majorVersion);

            glGetStringiFuncType glGetStringiFunc = reinterpret_cast<glGetStringiFuncType>(sf::priv::GlContext::getFunction("glGetStringi"));

            if (glGetErrorFunc() == GL_INVALID_ENUM || !glGetStringiFunc)
            {
                // Try to load the < 3.0 way
                const char* extensionString = reinterpret_cast<const char*>(glGetStringFunc(GL_EXTENSIONS));

                do
                {
                    const char* extension = extensionString;

                    while (*extensionString && (*extensionString != ' '))
                        extensionString++;

                    extensions.push_back(std::string(extension, extensionString));
                }
                while (*extensionString++);
            }
            else
            {
                // Try to load the >= 3.0 way
                int numExtensions = 0;
                glGetIntegervFunc(GL_NUM_EXTENSIONS, &numExtensions);

                if (numExtensions)
                {
                    for (unsigned int i = 0; i < static_cast<unsigned int>(numExtensions); ++i)
                    {
                        const char* extensionString = reinterpret_cast<const char*>(glGetStringiFunc(GL_EXTENSIONS, i));

                        extensions.push_back(extensionString);
                    }
                }
            }
        }